

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeCommandListUpdateMutableCommandKernelsExp
          (ze_command_list_handle_t hCommandList,uint32_t numKernels,uint64_t *pCommandId,
          ze_kernel_handle_t *phKernels)

{
  _func_void__ze_command_list_update_mutable_command_kernels_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_command_list_handle_t_ptr_uint_unsigned_long_ptr__ze_kernel_handle_t_ptr_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_110;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_f8;
  undefined1 local_e0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnCommandListUpdateMutableCommandKernelsExpCb_t epilogue_callback_ptr;
  ze_pfnCommandListUpdateMutableCommandKernelsExpCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_command_list_update_mutable_command_kernels_exp_params_t tracerParams;
  ze_pfnCommandListUpdateMutableCommandKernelsExp_t pfnUpdateMutableCommandKernelsExp;
  ze_kernel_handle_t *phKernels_local;
  uint64_t *pCommandId_local;
  undefined1 auStack_18 [4];
  uint32_t numKernels_local;
  ze_command_list_handle_t hCommandList_local;
  
  if (DAT_002da5a8 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr_uint_unsigned_long_ptr__ze_kernel_handle_t_ptr_ptr
       *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnUpdateMutableCommandKernelsExp = (ze_pfnCommandListUpdateMutableCommandKernelsExp_t)phKernels
    ;
    phKernels_local = (ze_kernel_handle_t *)pCommandId;
    pCommandId_local._4_4_ = numKernels;
    _auStack_18 = hCommandList;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_18;
      APITracerCallbackDataImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnCommandListUpdateMutableCommandKernelsExpCb_t)0x0;
            prologueCallbackPtr < (ze_pfnCommandListUpdateMutableCommandKernelsExpCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x2e8);
          p_Var1 = *(_func_void__ze_command_list_update_mutable_command_kernels_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x940);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_command_list_update_mutable_command_kernels_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_e0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_e0)
          ;
        }
      }
      zeApiPtr = DAT_002da5a8;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_f8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_110,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hCommandList_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,unsigned_int,unsigned_long*,_ze_kernel_handle_t**),_ze_command_list_update_mutable_command_kernels_exp_params_t*,void(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,unsigned_int&,unsigned_long*&,_ze_kernel_handle_t**&>
                     (zeApiPtr,(_ze_command_list_update_mutable_command_kernels_exp_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_command_list_update_mutable_command_kernels_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_f8,&local_110,
                      (_ze_command_list_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (uint *)((long)&pCommandId_local + 4),(unsigned_long **)&phKernels_local,
                      (_ze_kernel_handle_t ***)&pfnUpdateMutableCommandKernelsExp);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_110);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_f8);
      APITracerCallbackDataImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_command_list_update_mutable_command_kernels_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hCommandList_local._4_4_ =
           (*DAT_002da5a8)(_auStack_18,pCommandId_local._4_4_,(unsigned_long *)phKernels_local,
                           (_ze_kernel_handle_t **)pfnUpdateMutableCommandKernelsExp);
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListUpdateMutableCommandKernelsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numKernels,                            ///< [in] the number of kernels to update
        uint64_t* pCommandId,                           ///< [in][range(0, numKernels)] command identifier
        ze_kernel_handle_t* phKernels                   ///< [in][range(0, numKernels)] handle of the kernel for a command
                                                        ///< identifier to switch to
        )
    {
        auto pfnUpdateMutableCommandKernelsExp = context.zeDdiTable.CommandListExp.pfnUpdateMutableCommandKernelsExp;

        if( nullptr == pfnUpdateMutableCommandKernelsExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandListExp.pfnUpdateMutableCommandKernelsExp, hCommandList, numKernels, pCommandId, phKernels);

        // capture parameters
        ze_command_list_update_mutable_command_kernels_exp_params_t tracerParams = {
            &hCommandList,
            &numKernels,
            &pCommandId,
            &phKernels
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListUpdateMutableCommandKernelsExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListUpdateMutableCommandKernelsExpCb_t, CommandList, pfnUpdateMutableCommandKernelsExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandListExp.pfnUpdateMutableCommandKernelsExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pnumKernels,
                                                  *tracerParams.ppCommandId,
                                                  *tracerParams.pphKernels);
    }